

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O0

void __thiscall OpenMD::ZConstraintForceModifier::zeroVelocity(ZConstraintForceModifier *this)

{
  bool bVar1;
  pointer pZVar2;
  reference ppMVar3;
  double *pdVar4;
  long in_RDI;
  RealType vzMovingMols;
  iterator j;
  RealType pzMovingMols;
  IntegrableObjectIterator ii;
  StuntDouble *sd;
  Molecule *mol;
  iterator i;
  Vector3d vel;
  Vector3d comVel;
  Vector3<double> *in_stack_fffffffffffffe78;
  StuntDouble *in_stack_fffffffffffffe80;
  StuntDouble *in_stack_fffffffffffffe88;
  Molecule *in_stack_fffffffffffffe90;
  iterator *in_stack_fffffffffffffe98;
  Molecule *in_stack_fffffffffffffea0;
  Molecule *in_stack_fffffffffffffed8;
  _Self local_110;
  _List_node_base *local_108;
  StuntDouble *local_100;
  Molecule **local_e0;
  Molecule **local_d8;
  __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
  local_d0 [4];
  _Self local_b0;
  _List_node_base *local_a8;
  double local_a0;
  _Self local_68;
  _List_node_base *local_60;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_58;
  StuntDouble *local_50;
  Molecule *local_48;
  _List_iterator<OpenMD::ZconstraintMol> local_40;
  Vector<double,_3U> local_38;
  Vector<double,_3U> local_20;
  
  Vector3<double>::Vector3((Vector3<double> *)0x177d69);
  Vector3<double>::Vector3((Vector3<double> *)0x177d76);
  std::_List_iterator<OpenMD::ZconstraintMol>::_List_iterator(&local_40);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_58);
  local_60 = (_List_node_base *)
             std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::
             begin((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                   in_stack_fffffffffffffe78);
  local_40._M_node = local_60;
  while( true ) {
    local_68._M_node =
         (_List_node_base *)
         std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::end
                   ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                    in_stack_fffffffffffffe78);
    bVar1 = std::operator!=(&local_40,&local_68);
    if (!bVar1) break;
    pZVar2 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                       ((_List_iterator<OpenMD::ZconstraintMol> *)0x177df7);
    local_48 = pZVar2->mol;
    Molecule::getComVel(in_stack_fffffffffffffed8);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    local_50 = Molecule::beginIntegrableObject(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    while (local_50 != (StuntDouble *)0x0) {
      StuntDouble::getVel(in_stack_fffffffffffffe88);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      pdVar4 = Vector<double,_3U>::operator[](&local_20,2);
      in_stack_fffffffffffffea0 = (Molecule *)*pdVar4;
      pdVar4 = Vector<double,_3U>::operator[](&local_38,2);
      *pdVar4 = *pdVar4 - (double)in_stack_fffffffffffffea0;
      StuntDouble::setVel((StuntDouble *)in_stack_fffffffffffffe90,
                          (Vector3d *)in_stack_fffffffffffffe88);
      local_50 = Molecule::nextIntegrableObject(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98)
      ;
    }
    std::_List_iterator<OpenMD::ZconstraintMol>::operator++(&local_40);
  }
  local_a0 = 0.0;
  local_a8 = (_List_node_base *)
             std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::
             begin((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                   in_stack_fffffffffffffe78);
  local_40._M_node = local_a8;
  while( true ) {
    local_b0._M_node =
         (_List_node_base *)
         std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::end
                   ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                    in_stack_fffffffffffffe78);
    bVar1 = std::operator!=(&local_40,&local_b0);
    if (!bVar1) break;
    pZVar2 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                       ((_List_iterator<OpenMD::ZconstraintMol> *)0x177f80);
    local_48 = pZVar2->mol;
    Molecule::getComVel(in_stack_fffffffffffffed8);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    in_stack_fffffffffffffe98 = (iterator *)Molecule::getMass(in_stack_fffffffffffffe90);
    pdVar4 = Vector<double,_3U>::operator[](&local_20,2);
    local_a0 = (double)in_stack_fffffffffffffe98 * *pdVar4 + local_a0;
    std::_List_iterator<OpenMD::ZconstraintMol>::operator++(&local_40);
  }
  __gnu_cxx::
  __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
  ::__normal_iterator(local_d0);
  local_d8 = (Molecule **)
             std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::begin
                       ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                        in_stack_fffffffffffffe78);
  local_d0[0]._M_current = local_d8;
  while( true ) {
    local_e0 = (Molecule **)
               std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::end
                         ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                          in_stack_fffffffffffffe78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
                        *)in_stack_fffffffffffffe80,
                       (__normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
                        *)in_stack_fffffffffffffe78);
    if (!bVar1) break;
    ppMVar3 = __gnu_cxx::
              __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
              ::operator*(local_d0);
    local_48 = *ppMVar3;
    Molecule::getComVel(in_stack_fffffffffffffed8);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    in_stack_fffffffffffffe90 = (Molecule *)Molecule::getMass(in_stack_fffffffffffffe90);
    pdVar4 = Vector<double,_3U>::operator[](&local_20,2);
    local_a0 = (double)in_stack_fffffffffffffe90 * *pdVar4 + local_a0;
    __gnu_cxx::
    __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
    ::operator++(local_d0);
  }
  local_100 = (StuntDouble *)(local_a0 / (*(double *)(in_RDI + 0xf0) + *(double *)(in_RDI + 0xf8)));
  local_108 = (_List_node_base *)
              std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::
              begin((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                    in_stack_fffffffffffffe78);
  local_40._M_node = local_108;
  while( true ) {
    local_110._M_node =
         (_List_node_base *)
         std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::end
                   ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                    in_stack_fffffffffffffe78);
    bVar1 = std::operator!=(&local_40,&local_110);
    if (!bVar1) break;
    pZVar2 = std::_List_iterator<OpenMD::ZconstraintMol>::operator->
                       ((_List_iterator<OpenMD::ZconstraintMol> *)0x17819b);
    local_48 = pZVar2->mol;
    local_50 = Molecule::beginIntegrableObject(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    while (local_50 != (StuntDouble *)0x0) {
      StuntDouble::getVel(in_stack_fffffffffffffe88);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe88 = local_100;
      pdVar4 = Vector<double,_3U>::operator[](&local_38,2);
      *pdVar4 = *pdVar4 - (double)in_stack_fffffffffffffe88;
      StuntDouble::setVel((StuntDouble *)in_stack_fffffffffffffe90,
                          (Vector3d *)in_stack_fffffffffffffe88);
      local_50 = Molecule::nextIntegrableObject(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98)
      ;
    }
    std::_List_iterator<OpenMD::ZconstraintMol>::operator++(&local_40);
  }
  local_d0[0]._M_current =
       (Molecule **)
       std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::begin
                 ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
                  in_stack_fffffffffffffe78);
  while( true ) {
    std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::end
              ((vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *)
               in_stack_fffffffffffffe78);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
                        *)in_stack_fffffffffffffe80,
                       (__normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
                        *)in_stack_fffffffffffffe78);
    if (!bVar1) break;
    ppMVar3 = __gnu_cxx::
              __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
              ::operator*(local_d0);
    local_48 = *ppMVar3;
    local_50 = Molecule::beginIntegrableObject(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    while (local_50 != (StuntDouble *)0x0) {
      StuntDouble::getVel(in_stack_fffffffffffffe88);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe80 = local_100;
      pdVar4 = Vector<double,_3U>::operator[](&local_38,2);
      *pdVar4 = *pdVar4 - (double)in_stack_fffffffffffffe80;
      StuntDouble::setVel((StuntDouble *)in_stack_fffffffffffffe90,
                          (Vector3d *)in_stack_fffffffffffffe88);
      local_50 = Molecule::nextIntegrableObject(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98)
      ;
    }
    __gnu_cxx::
    __normal_iterator<OpenMD::Molecule_**,_std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>_>
    ::operator++(local_d0);
  }
  return;
}

Assistant:

void ZConstraintForceModifier::zeroVelocity() {
    Vector3d comVel;
    Vector3d vel;
    std::list<ZconstraintMol>::iterator i;
    Molecule* mol;
    StuntDouble* sd;
    Molecule::IntegrableObjectIterator ii;

    // Zero out the velocities of center of mass of fixed
    // z-constrained molecules
    for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
      mol    = i->mol;
      comVel = mol->getComVel();

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        vel = sd->getVel();
        vel[whichDirection] -= comVel[whichDirection];
        sd->setVel(vel);
      }
    }

    // Calculate the vz of center of mass of moving molecules
    // (including unconstrained molecules and moving z-constrained
    // molecules)

    RealType pzMovingMols = 0.0;

    for (i = movingZMols_.begin(); i != movingZMols_.end(); ++i) {
      mol    = i->mol;
      comVel = mol->getComVel();
      pzMovingMols += mol->getMass() * comVel[whichDirection];
    }

    std::vector<Molecule*>::iterator j;
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      mol    = *j;
      comVel = mol->getComVel();
      pzMovingMols += mol->getMass() * comVel[whichDirection];
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &pzMovingMols, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    RealType vzMovingMols =
        pzMovingMols / (totMassMovingZMols_ + totMassUnconsMols_);

    // Modify the velocities of moving z-constrained molecules

    for (i = movingZMols_.begin(); i != movingZMols_.end(); ++i) {
      mol = i->mol;

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        vel = sd->getVel();
        vel[whichDirection] -= vzMovingMols;
        sd->setVel(vel);
      }
    }

    // Modify the velocites of unconstrained molecules
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      mol = *j;

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        vel = sd->getVel();
        vel[whichDirection] -= vzMovingMols;
        sd->setVel(vel);
      }
    }
  }